

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O1

void pbrt::StatsReportPixelStart(Point2i *p)

{
  undefined8 uVar1;
  long in_FS_OFFSET;
  
  if (pixelStatsEnabled == '\x01') {
    if (*(char *)(in_FS_OFFSET + -0xb8) == '\0') {
      StatsReportPixelStart();
    }
    if (*(char *)(in_FS_OFFSET + -0xd0) != '\0') {
      LogFatal<char_const(&)[33]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/stats.cpp"
                 ,0x3d,"Check failed: %s",(char (*) [33])"threadStatsState.active == false");
    }
    if (*(char *)(in_FS_OFFSET + -0xb8) == '\0') {
      StatsReportPixelStart();
    }
    *(undefined1 *)(in_FS_OFFSET + -0xd0) = 1;
    if (*(char *)(in_FS_OFFSET + -0xb8) == '\0') {
      StatsReportPixelStart();
    }
    *(Tuple2<pbrt::Point2,_int> *)(in_FS_OFFSET + -0xd8) = p->super_Tuple2<pbrt::Point2,_int>;
    uVar1 = std::chrono::_V2::steady_clock::now();
    if (*(char *)(in_FS_OFFSET + -0xb8) == '\0') {
      StatsReportPixelStart();
    }
    *(undefined8 *)(in_FS_OFFSET + -200) = uVar1;
  }
  return;
}

Assistant:

void StatsReportPixelStart(const Point2i &p) {
    if (!pixelStatsEnabled)
        return;
    CHECK(threadStatsState.active == false);
    threadStatsState.active = true;
    threadStatsState.p = p;
    threadStatsState.start = std::chrono::steady_clock::now();
}